

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3 *pMP3,char *pFilePath,
                             ma_allocation_callbacks *pAllocationCallbacks)

{
  FILE *pUserData;
  ma_result mVar1;
  ma_bool32 mVar2;
  FILE *pFile;
  FILE *local_20;
  
  mVar1 = ma_fopen((FILE **)&local_20,pFilePath,"rb");
  pUserData = local_20;
  if (mVar1 == MA_SUCCESS) {
    if (pMP3 != (ma_dr_mp3 *)0x0) {
      memset(pMP3,0,0x3ec0);
      mVar2 = ma_dr_mp3_init_internal
                        (pMP3,ma_dr_mp3__on_read_stdio,ma_dr_mp3__on_seek_stdio,pUserData,
                         pAllocationCallbacks);
      if (mVar2 != 0) {
        return 1;
      }
    }
    fclose(local_20);
  }
  return 0;
}

Assistant:

MA_API ma_bool32 ma_dr_mp3_init_file(ma_dr_mp3* pMP3, const char* pFilePath, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    FILE* pFile;
    if (ma_fopen(&pFile, pFilePath, "rb") != MA_SUCCESS) {
        return MA_FALSE;
    }
    result = ma_dr_mp3_init(pMP3, ma_dr_mp3__on_read_stdio, ma_dr_mp3__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}